

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_variable_path.c
# Opt level: O0

char * environment_variable_path_create
                 (char *name,char *default_path,size_t default_path_size,size_t *env_size)

{
  size_t *in_RCX;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t end;
  size_t last;
  size_t size;
  size_t length;
  char *path;
  char *path_ptr;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  char *local_30;
  long local_20;
  char *local_18;
  char *local_8;
  
  local_30 = getenv(in_RDI);
  if (local_30 == (char *)0x0) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    if (in_RSI == (char *)0x0) {
      local_18 = "";
      local_20 = 1;
    }
    local_30 = local_18;
    local_40 = local_20 - 1;
  }
  else {
    local_40 = strlen(local_30);
  }
  local_50 = local_40 - 1;
  if (local_30[local_50] == '/') {
    local_58 = local_40;
    local_48 = local_40 + 1;
  }
  else {
    local_50 = local_40;
    local_58 = local_40 + 1;
    local_48 = local_40 + 2;
  }
  local_8 = (char *)malloc(local_48);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    strncpy(local_8,local_30,local_40);
    local_8[local_50] = '/';
    local_8[local_58] = '\0';
    if (in_RCX != (size_t *)0x0) {
      *in_RCX = local_48;
    }
  }
  return local_8;
}

Assistant:

char *environment_variable_path_create(const char *name, const char *default_path, size_t default_path_size, size_t *env_size)
{
	const char *path_ptr = getenv(name);
	char *path;
	size_t length, size, last, end;

	if (path_ptr == NULL)
	{
		if (default_path == NULL)
		{
			static const char empty_path[] = "";

			default_path = empty_path;
			default_path_size = sizeof(empty_path);
		}

		path_ptr = default_path;
		length = default_path_size - 1;
	}
	else
	{
		length = strlen(path_ptr);
	}

	last = length - 1;

	if (ENVIRONMENT_VARIABLE_PATH_SEPARATOR(path_ptr[last]))
	{
		end = length;
		size = length + 1;
	}
	else
	{
		last = length;
		end = length + 1;
		size = length + 2;
	}

	path = malloc(sizeof(char) * size);

	if (path == NULL)
	{
		return NULL;
	}

	strncpy(path, path_ptr, length);

	path[last] = ENVIRONMENT_VARIABLE_PATH_SEPARATOR_C;
	path[end] = '\0';

	if (env_size != NULL)
	{
		*env_size = size;
	}

	return path;
}